

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.h
# Opt level: O3

Error __thiscall
asmjit::ZoneVector<asmjit::VirtReg_*>::append
          (ZoneVector<asmjit::VirtReg_*> *this,ZoneHeap *heap,VirtReg **item)

{
  size_t *psVar1;
  Error EVar2;
  size_t sVar3;
  
  sVar3 = (this->super_ZoneVectorBase)._length;
  if (sVar3 == (this->super_ZoneVectorBase)._capacity) {
    EVar2 = ZoneVectorBase::_grow(&this->super_ZoneVectorBase,heap,8,1);
    if (EVar2 != 0) {
      return EVar2;
    }
    sVar3 = (this->super_ZoneVectorBase)._length;
  }
  *(VirtReg **)((long)(this->super_ZoneVectorBase)._data + sVar3 * 8) = *item;
  psVar1 = &(this->super_ZoneVectorBase)._length;
  *psVar1 = *psVar1 + 1;
  return 0;
}

Assistant:

Error append(ZoneHeap* heap, const T& item) noexcept {
    if (ASMJIT_UNLIKELY(_length == _capacity))
      ASMJIT_PROPAGATE(grow(heap, 1));

    ::memcpy(static_cast<T*>(_data) + _length, &item, sizeof(T));

    _length++;
    return kErrorOk;
  }